

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_test.cc
# Opt level: O3

Loss * xLearn::CreateLoss(char *format_name)

{
  Loss *pLVar1;
  allocator local_31;
  string local_30;
  
  if (GetRegistry_xLearn_loss_registry()::registry == '\0') {
    CreateLoss();
  }
  std::__cxx11::string::string((string *)&local_30,format_name,&local_31);
  pLVar1 = ObjectCreatorRegistry_xLearn_loss_registry::CreateObject
                     ((ObjectCreatorRegistry_xLearn_loss_registry *)
                      GetRegistry_xLearn_loss_registry()::registry,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return pLVar1;
}

Assistant:

Loss* CreateLoss(const char* format_name) {
  return CREATE_LOSS(format_name);
}